

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O1

void __thiscall
OpenMD::EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint
          (EqualIgnoreCaseConstraint *this,string *rhs)

{
  locale *in_RCX;
  stringstream iss;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [128];
  ios_base local_130 [264];
  
  (this->super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>).description_._M_dataplus.
  _M_p = (pointer)&(this->super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>).
                   description_.field_2;
  (this->super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>).description_.
  _M_string_length = 0;
  (this->super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>).description_.field_2.
  _M_local_buf[0] = '\0';
  std::locale::locale((locale *)local_1b0);
  toUpperCopy<std::__cxx11::string>
            (&this->rhs_,(OpenMD *)rhs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,in_RCX);
  std::locale::~locale((locale *)local_1b0);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 0x10),"equal to (case insensitive) ",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 0x10),(rhs->_M_dataplus)._M_p,rhs->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,(string *)local_1d0);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

EqualIgnoreCaseConstraint(std::string rhs) :
        rhs_(OpenMD::toUpperCopy(rhs)) {
      std::stringstream iss;
      iss << "equal to (case insensitive) " << rhs;
      this->description_ = iss.str();
    }